

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O0

void rfc5444_writer_unregister_pkthandler(rfc5444_writer *writer,rfc5444_writer_pkthandler *pkt)

{
  list_entity *plVar1;
  list_entity *plVar2;
  bool bVar3;
  rfc5444_writer_pkthandler *pkt_local;
  rfc5444_writer *writer_local;
  
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                  ,0x20b,
                  "void rfc5444_writer_unregister_pkthandler(struct rfc5444_writer *, struct rfc5444_writer_pkthandler *)"
                 );
  }
  bVar3 = false;
  if ((pkt->_pkthandle_node).next != (list_entity *)0x0) {
    bVar3 = (pkt->_pkthandle_node).prev != (list_entity *)0x0;
  }
  if (bVar3) {
    plVar1 = (pkt->_pkthandle_node).prev;
    plVar2 = (pkt->_pkthandle_node).next;
    plVar1->next = plVar2;
    plVar2->prev = plVar1;
    (pkt->_pkthandle_node).prev = (list_entity *)0x0;
    (pkt->_pkthandle_node).next = (list_entity *)0x0;
  }
  return;
}

Assistant:

void
rfc5444_writer_unregister_pkthandler(
  struct rfc5444_writer *writer __attribute__((unused)), struct rfc5444_writer_pkthandler *pkt) {
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif
  if (list_is_node_added(&pkt->_pkthandle_node)) {
    list_remove(&pkt->_pkthandle_node);
  }
}